

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O2

void __thiscall
dap::BasicTypeInfo<dap::ProcessEvent>::destruct(BasicTypeInfo<dap::ProcessEvent> *this,void *ptr)

{
  ProcessEvent::~ProcessEvent((ProcessEvent *)ptr);
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }